

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::addMemberDecoration(Builder *this,Id id,uint member,Decoration decoration,char *s)

{
  Instruction *this_00;
  value_type local_38;
  Instruction *local_30;
  Instruction *dec;
  char *s_local;
  uint local_18;
  Decoration decoration_local;
  uint member_local;
  Id id_local;
  Builder *this_local;
  
  if (decoration != DecorationMax) {
    dec = (Instruction *)s;
    s_local._4_4_ = decoration;
    local_18 = member;
    decoration_local = id;
    _member_local = this;
    this_00 = (Instruction *)::operator_new(0x60);
    spv::Instruction::Instruction(this_00,OpMemberDecorateString);
    local_30 = this_00;
    spv::Instruction::reserveOperands(this_00,4);
    spv::Instruction::addIdOperand(local_30,decoration_local);
    spv::Instruction::addImmediateOperand(local_30,local_18);
    spv::Instruction::addImmediateOperand(local_30,s_local._4_4_);
    spv::Instruction::addStringOperand(local_30,(char *)dec);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_38,
               local_30);
    std::
    set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::insert(&this->decorations,&local_38);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_38);
  }
  return;
}

Assistant:

void Builder::addMemberDecoration(Id id, unsigned int member, Decoration decoration, const char *s)
{
    if (decoration == spv::DecorationMax)
        return;

    Instruction* dec = new Instruction(OpMemberDecorateStringGOOGLE);
    dec->reserveOperands(4);
    dec->addIdOperand(id);
    dec->addImmediateOperand(member);
    dec->addImmediateOperand(decoration);
    dec->addStringOperand(s);

    decorations.insert(std::unique_ptr<Instruction>(dec));
}